

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::openPersistentEditor(QAbstractItemView *this,QModelIndex *index)

{
  bool bVar1;
  QAbstractItemViewPrivate *this_00;
  QWidget *pQVar2;
  StateFlag other;
  QSet<QWidget_*> *in_RSI;
  QStyleOptionViewItem *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QWidget *editor;
  QStyleOptionViewItem options;
  QModelIndex *in_stack_fffffffffffffeb8;
  QStyleOptionViewItem *in_stack_fffffffffffffef8;
  QModelIndex *in_stack_ffffffffffffff00;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff08;
  undefined1 local_d8 [8];
  QFlags<QStyle::StateFlag> aQStack_d0 [2];
  undefined1 local_c8 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractItemView *)0x80cb85);
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x80cba8);
  (**(code **)(*(long *)&in_RDI->super_QStyleOption + 0x2f8))(in_RDI,local_d8);
  local_c8 = (**(code **)(*(long *)&in_RDI->super_QStyleOption + 0x1e0))(in_RDI,in_RSI);
  currentIndex((QAbstractItemView *)this_00);
  bVar1 = ::operator==((QModelIndex *)in_RDI,in_stack_fffffffffffffeb8);
  other = State_None;
  if (bVar1) {
    other = State_HasFocus;
  }
  QFlags<QStyle::StateFlag>::operator|=(aQStack_d0,other);
  pQVar2 = QAbstractItemViewPrivate::editor
                     (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
  ;
  if (pQVar2 != (QWidget *)0x0) {
    QWidget::show((QWidget *)this_00);
    QSet<QWidget_*>::insert(in_RSI,(QWidget **)this_00);
  }
  QStyleOptionViewItem::~QStyleOptionViewItem(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::openPersistentEditor(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    QStyleOptionViewItem options;
    initViewItemOption(&options);
    options.rect = visualRect(index);
    options.state |= (index == currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);

    QWidget *editor = d->editor(index, options);
    if (editor) {
        editor->show();
        d->persistent.insert(editor);
    }
}